

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_set_var_test(void)

{
  long *plVar1;
  uint64_t uVar2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  bnode *pbVar10;
  size_t sVar11;
  ushort *puVar12;
  undefined2 *puVar13;
  btree_kv_ops *pbVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  long lVar17;
  char *pcVar18;
  undefined8 *puVar19;
  bool bVar20;
  undefined8 *puVar21;
  long lVar22;
  ulong uVar23;
  bnode *pbVar24;
  void *pvVar25;
  char cVar26;
  long lVar27;
  ulong __n;
  char *__s;
  void *key;
  timeval __test_begin;
  undefined1 auStack_6a7 [310];
  char acStack_571 [383];
  char acStack_3f2 [170];
  undefined8 auStack_348 [5];
  undefined8 uStack_320;
  undefined8 auStack_318 [6];
  btree_kv_ops bStack_2e8;
  timeval tStack_268;
  char *apcStack_258 [6];
  void *pvStack_228;
  ulong uStack_220;
  bnode *pbStack_218;
  undefined8 *puStack_210;
  undefined1 uStack_201;
  void *pvStack_200;
  char *pcStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  long lStack_1e0;
  code *pcStack_1d8;
  btree_kv_ops bStack_1d0;
  undefined8 uStack_158;
  undefined8 auStack_150 [6];
  timeval tStack_120;
  btree_kv_ops *pbStack_110;
  bnode *pbStack_108;
  char cStack_f9;
  bnode *pbStack_f8;
  undefined1 *puStack_f0;
  btree_kv_ops *pbStack_e8;
  char *pcStack_e0;
  uint64_t uStack_d8;
  long local_c8;
  undefined2 *local_c0;
  timeval local_b8;
  btree_kv_ops local_a8;
  
  gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
  memleak_start();
  local_c0 = (undefined2 *)malloc(0xd);
  *local_c0 = 0xb00;
  *(undefined8 *)(local_c0 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)local_c0 + 9) = 0x676e69;
  local_c8 = 10;
  btree_str_kv_get_kb64_vb64(&local_a8);
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0xd08;
  pbVar10->flag = 0;
  pbVar10->level = 1;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = pbVar10 + 1;
  (*local_a8.set_kv)(pbVar10,0,&local_c0,&local_c8);
  uVar2 = (pbVar10->field_4).dummy;
  iVar7 = strcmp((char *)(uVar2 + 2),"teststring");
  if (iVar7 == 0) {
    if (*(long *)(uVar2 + 0xd) == local_c8) {
      kv_set_var_test();
      return;
    }
  }
  else {
    kv_set_var_test();
  }
  kv_set_var_test();
  pcStack_e0 = "teststring";
  lVar17 = 0;
  uStack_158 = 0x102f32;
  pbStack_f8 = pbVar10;
  puStack_f0 = (undefined1 *)&local_c8;
  pbStack_e8 = &local_a8;
  uStack_d8 = uVar2;
  gettimeofday(&tStack_120,(__timezone_ptr_t)0x0);
  uStack_158 = 0x102f37;
  memleak_start();
  do {
    pcVar18 = *(char **)((long)&DAT_00109d70 + lVar17);
    uStack_158 = 0x102f4a;
    sVar11 = strlen(pcVar18);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    uStack_158 = 0x102f59;
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    uStack_158 = 0x102f76;
    memcpy(puVar12 + 1,pcVar18,uVar23);
    *(ushort **)((long)auStack_150 + lVar17) = puVar12;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x30);
  uStack_158 = 0x102f8f;
  pbStack_108 = (bnode *)malloc(0x1010);
  pbStack_108->kvsize = 0x901;
  pbStack_108->flag = 0;
  pbStack_108->level = 1;
  pbStack_108->nentry = 6;
  (pbStack_108->field_4).data = pbStack_108 + 1;
  cStack_f9 = 'd';
  pbStack_110 = &bStack_1d0;
  pcStack_1d8 = (code *)0x102fc2;
  btree_str_kv_get_kb64_vb64(pbStack_110);
  lVar22 = 0;
  lVar17 = 0;
  lVar27 = 0;
  while( true ) {
    pbVar10 = pbStack_108;
    pcStack_1d8 = (code *)0x102fe9;
    (*pbStack_110->set_kv)
              (pbStack_108,(idx_t)lVar17,(void *)((long)auStack_150 + lVar22),&cStack_f9);
    pvVar25 = (pbVar10->field_4).data;
    pcVar18 = *(char **)((long)&DAT_00109d70 + lVar22);
    pcStack_1d8 = (code *)0x103008;
    iVar7 = strcmp((char *)((long)pvVar25 + lVar27 + 2),pcVar18);
    if (iVar7 != 0) break;
    pcStack_1d8 = (code *)0x103014;
    sVar11 = strlen(pcVar18);
    cVar26 = *(char *)((long)pvVar25 + lVar27 + sVar11 + 3);
    if (cVar26 != cStack_f9) {
      pcStack_1d8 = (code *)0x103066;
      kv_set_var_nentry_test();
      break;
    }
    lVar27 = lVar27 + sVar11 + 4;
    cStack_f9 = cVar26 + '\x01';
    lVar17 = lVar17 + 1;
    lVar22 = lVar22 + 8;
    if (lVar17 == 6) {
      pcStack_1d8 = (code *)0x103052;
      kv_set_var_nentry_test();
      return;
    }
  }
  pcStack_1d8 = kv_set_var_nentry_update_test;
  kv_set_var_nentry_test();
  puVar16 = auStack_318;
  uVar23 = 0;
  uStack_320 = 0x103090;
  pvStack_200 = pvVar25;
  pcStack_1f8 = pcVar18;
  lStack_1f0 = lVar17;
  lStack_1e8 = lVar22;
  lStack_1e0 = lVar27;
  pcStack_1d8 = (code *)&stack0xffffffffffffff30;
  gettimeofday(&tStack_268,(__timezone_ptr_t)0x0);
  uStack_320 = 0x103095;
  memleak_start();
  apcStack_258[4] = "123231234242423428492342";
  apcStack_258[5] = "string WITH space";
  apcStack_258[2] = "longerstring";
  apcStack_258[3] = "";
  apcStack_258[0] = "string";
  apcStack_258[1] = "longstring";
  uStack_320 = 0x1030c0;
  pbStack_218 = (bnode *)malloc(0x1010);
  pbStack_218->kvsize = 0x901;
  pbStack_218->flag = 0;
  pbStack_218->level = 1;
  pbStack_218->nentry = 6;
  (pbStack_218->field_4).data = pbStack_218 + 1;
  uStack_201 = 100;
  uStack_320 = 0x1030ec;
  btree_str_kv_get_kb64_vb64(&bStack_2e8);
  pcVar18 = (char *)0x0;
  pbVar10 = (bnode *)0x0;
  do {
    __s = *(char **)((long)apcStack_258 + uVar23);
    uStack_320 = 0x1030fe;
    sVar11 = strlen(__s);
    uVar8 = (int)sVar11 + 1;
    puStack_210 = (undefined8 *)((long)auStack_318 + uVar23);
    puVar19 = (undefined8 *)(ulong)(uVar8 & 0xffff);
    uStack_320 = 0x103120;
    uStack_220 = uVar23;
    puVar12 = (ushort *)malloc((long)puVar19 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    uStack_320 = 0x10313d;
    memcpy(puVar12 + 1,__s,(size_t)puVar19);
    puVar21 = puStack_210;
    *puStack_210 = puVar12;
    pbVar24 = pbStack_218;
    uStack_320 = 0x103159;
    (*bStack_2e8.set_kv)(pbStack_218,(idx_t)pcVar18,puVar21,&uStack_201);
    uStack_320 = 0x10316d;
    iVar7 = strcmp((char *)((long)(pbVar24->field_4).data + (long)pbVar10 + 2),__s);
    if (iVar7 != 0) {
      uStack_320 = 0x103378;
      kv_set_var_nentry_update_test();
      goto LAB_00103378;
    }
    uStack_320 = 0x10317d;
    sVar11 = strlen(__s);
    pbVar10 = (bnode *)((long)&pbVar10->level + sVar11);
    pcVar18 = (char *)(ulong)((int)pcVar18 + 1);
    uVar23 = uStack_220 + 8;
  } while (uVar23 != 0x30);
  lVar17 = 0;
  do {
    uStack_320 = 0x1031a8;
    free((void *)auStack_318[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 6);
  puVar16 = auStack_348;
  puStack_210 = puVar16;
  pbVar24 = (bnode *)0x0;
  iVar7 = 0;
  puVar21 = (undefined8 *)0x0;
  do {
    uStack_220 = CONCAT44(uStack_220._4_4_,iVar7);
    pcVar18 = *(char **)((long)apcStack_258 + (long)pbVar24);
    sVar11 = strlen(pcVar18);
    uVar8 = (int)sVar11 + 1;
    pvStack_228 = (void *)((long)puStack_210 + (long)pbVar24);
    __n = (ulong)(uVar8 & 0xffff);
    puVar12 = (ushort *)malloc(__n + 2);
    uVar23 = uStack_220;
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    iVar7 = (int)uStack_220;
    __s = (char *)(uStack_220 & 0xffffffff);
    memcpy(puVar12 + 1,pcVar18,__n);
    pbVar10 = pbStack_218;
    *(ushort **)((long)puStack_210 + (long)pbVar24) = puVar12;
    (*bStack_2e8.set_kv)(pbStack_218,(idx_t)uVar23,pvStack_228,&uStack_201);
    iVar9 = strcmp((char *)((long)(pbVar10->field_4).data + (long)puVar21 + 2),pcVar18);
    puVar19 = puVar21;
    if (iVar9 != 0) goto LAB_00103378;
    sVar11 = strlen(pcVar18);
    puVar19 = puStack_210;
    pbVar10 = pbStack_218;
    puVar21 = (undefined8 *)((long)puVar21 + sVar11 + 4);
    iVar7 = iVar7 + 1;
    pbVar24 = (bnode *)&pbVar24->field_4;
  } while (pbVar24 != (bnode *)0x30);
  (*bStack_2e8.set_kv)(pbStack_218,3,puStack_210,&uStack_201);
  apcStack_258[3] = "string";
  pbVar24 = (bnode *)0x0;
  (*bStack_2e8.set_kv)(pbVar10,0,puVar19 + 5,&uStack_201);
  apcStack_258[0] = "string WITH space";
  (*bStack_2e8.set_kv)(pbVar10,5,puVar19,&uStack_201);
  apcStack_258[5] = "string";
  pbVar10 = (bnode *)((pbVar10->field_4).dummy + 2);
  pcVar18 = (char *)0x0;
  while( true ) {
    __s = apcStack_258[(long)pbVar24];
    iVar7 = strcmp(pcVar18 + (long)&pbVar10->kvsize,__s);
    if (iVar7 != 0) break;
    sVar11 = strlen(__s);
    pcVar18 = pcVar18 + sVar11 + 4;
    pbVar24 = (bnode *)((long)&pbVar24->kvsize + 1);
    if (pbVar24 == (bnode *)0x6) {
      free(pbStack_218);
      lVar17 = 0;
      do {
        free((void *)puVar19[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 6);
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_set_var_nentry_update_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar18,"kv_set_var_nentry_update_test");
      return;
    }
  }
LAB_0010337d:
  puVar16[-1] = kv_get_var_test;
  kv_set_var_nentry_update_test();
  puVar16[-1] = &pcStack_1d8;
  puVar16[-2] = __s;
  puVar16[-3] = pbVar24;
  puVar16[-4] = puVar19;
  puVar16[-5] = pcVar18;
  puVar16[-6] = pbVar10;
  puVar16[-0x10] = 0x10339c;
  gettimeofday((timeval *)(puVar16 + -8),(__timezone_ptr_t)0x0);
  puVar16[-0x10] = 0x1033a1;
  memleak_start();
  puVar16[-0x10] = 0x1033ab;
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  pcVar18 = "teststring";
  puVar21 = puVar16 + -0xc;
  *puVar21 = puVar13;
  puVar16[-0x10] = 0x1033df;
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0xd08;
  pbVar10->flag = 0;
  pbVar10->level = 1;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = pbVar10 + 1;
  puVar19 = puVar16 + -0xe;
  *puVar19 = 0x14;
  plVar1 = puVar16 + -0xd;
  *plVar1 = 0;
  puVar16[-0x10] = 0x103418;
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var3 = pbVar14->set_kv;
  puVar16[-0x10] = 0x103429;
  (*p_Var3)(pbVar10,0,puVar21,puVar19);
  p_Var3 = pbVar14->get_kv;
  puVar16[-0x10] = 0x103437;
  (*p_Var3)(pbVar10,0,plVar1,puVar16 + -0xf);
  puVar16[-0x10] = 0x103447;
  iVar7 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar7 == 0) {
    if (puVar16[-0xf] != puVar16[-0xe]) goto LAB_00103552;
    pcVar18 = (char *)(puVar16 + -0xd);
    p_Var3 = pbVar14->get_kv;
    puVar16[-0x10] = 0x103471;
    (*p_Var3)(pbVar10,0,pcVar18,puVar16 + -0xf);
    puVar16[-0x10] = 0x103484;
    iVar7 = strcmp((char *)(*(long *)pcVar18 + 2),"teststring");
    if (iVar7 != 0) goto LAB_00103557;
    if (puVar16[-0xf] != puVar16[-0xe]) goto LAB_0010355c;
    p_Var3 = pbVar14->get_kv;
    puVar16[-0x10] = 0x1034ad;
    (*p_Var3)(pbVar10,0,puVar16 + -0xd,(void *)0x0);
    pcVar18 = (char *)puVar16[-0xd];
    puVar16[-0x10] = 0x1034c0;
    iVar7 = strcmp((char *)((long)pcVar18 + 2),"teststring");
    if (iVar7 != 0) goto LAB_00103561;
    if (puVar16[-0xf] == puVar16[-0xe]) {
      puVar16[-0x10] = 0x1034df;
      free(pbVar10);
      puVar16[-0xb] = pbVar14;
      puVar16[-10] = puVar16[-0xc];
      puVar16[-9] = pcVar18;
      lVar17 = 0;
      do {
        pvVar25 = (void *)puVar16[lVar17 + -0xb];
        puVar16[-0x10] = 0x1034ff;
        free(pvVar25);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      puVar16[-0x10] = 0x10350d;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_get_var_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      puVar16[-0x10] = 0x10353e;
      fprintf(_stderr,pcVar18,"kv_get_var_test");
      return;
    }
  }
  else {
    puVar16[-0x10] = 0x103552;
    kv_get_var_test();
LAB_00103552:
    puVar16[-0x10] = 0x103557;
    kv_get_var_test();
LAB_00103557:
    puVar16[-0x10] = 0x10355c;
    kv_get_var_test();
LAB_0010355c:
    puVar16[-0x10] = 0x103561;
    kv_get_var_test();
LAB_00103561:
    puVar16[-0x10] = 0x103566;
    kv_get_var_test();
  }
  puVar16[-0x10] = kv_get_var_nentry_test;
  kv_get_var_test();
  puVar16[-0x10] = plVar1;
  puVar16[-0x11] = pcVar18;
  puVar16[-0x12] = pbVar14;
  puVar16[-0x13] = puVar19;
  puVar16[-0x14] = puVar21;
  puVar16[-0x15] = pbVar10;
  lVar17 = 0;
  puVar16[-0x23] = 0x10358d;
  gettimeofday((timeval *)(puVar16 + -0x22),(__timezone_ptr_t)0x0);
  puVar16[-0x23] = 0x103592;
  memleak_start();
  puVar16[-0x17] = 0;
  puVar21 = &DAT_00109d70;
  do {
    pcVar18 = *(char **)((long)&DAT_00109d70 + lVar17);
    puVar16[-0x23] = 0x1035ad;
    sVar11 = strlen(pcVar18);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    puVar16[-0x23] = 0x1035bc;
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    puVar16[-0x23] = 0x1035d9;
    memcpy(puVar12 + 1,pcVar18,uVar23);
    *(ushort **)((long)puVar16 + lVar17 + -0x100) = puVar12;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x30);
  puVar16[-0x23] = 0x1035f2;
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0x901;
  pbVar10->flag = 0;
  pbVar10->level = 1;
  pbVar10->nentry = 6;
  (pbVar10->field_4).data = pbVar10 + 1;
  *(undefined1 *)((long)puVar16 + -0xa9) = 100;
  pbVar14 = (btree_kv_ops *)(puVar16 + -0x32);
  puVar16[-0x33] = 0x103623;
  btree_str_kv_get_kb64_vb64(pbVar14);
  puVar19 = puVar16 + -0x20;
  uVar23 = 0;
  do {
    puVar16[-0x33] = 0x10363c;
    (*(code *)puVar16[-0x31])(pbVar10,uVar23 & 0xffff,puVar19,(undefined1 *)((long)puVar16 + -0xa9))
    ;
    *(char *)((long)puVar16 + -0xa9) = *(char *)((long)puVar16 + -0xa9) + '\x01';
    uVar23 = uVar23 + 1;
    puVar19 = puVar19 + 1;
  } while (uVar23 != 6);
  *(undefined1 *)((long)puVar16 + -0xa9) = 100;
  lVar17 = 0;
  while( true ) {
    p_Var3 = pbVar14->get_kv;
    puVar16[-0x33] = 0x103665;
    (*p_Var3)(pbVar10,(idx_t)lVar17,puVar16 + -0x17,(undefined1 *)((long)puVar16 + -0xaa));
    lVar22 = puVar16[-0x17];
    pcVar18 = (char *)*puVar21;
    puVar16[-0x33] = 0x103677;
    iVar7 = strcmp((char *)(lVar22 + 2),pcVar18);
    if (iVar7 != 0) break;
    if (*(char *)((long)puVar16 + -0xaa) != *(char *)((long)puVar16 + -0xa9)) {
      puVar16[-0x33] = 0x103719;
      kv_get_var_nentry_test();
      break;
    }
    *(char *)((long)puVar16 + -0xa9) = *(char *)((long)puVar16 + -0xaa) + '\x01';
    lVar17 = lVar17 + 1;
    puVar21 = puVar21 + 1;
    if (lVar17 == 6) {
      puVar16[-0x1a] = pbVar10;
      puVar16[-0x19] = lVar22;
      lVar17 = 0;
      do {
        pvVar25 = (void *)puVar16[lVar17 + -0x1a];
        puVar16[-0x33] = 0x1036b1;
        free(pvVar25);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
      lVar17 = 0;
      do {
        pvVar25 = (void *)puVar16[lVar17 + -0x20];
        puVar16[-0x33] = 0x1036c6;
        free(pvVar25);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 6);
      puVar16[-0x33] = 0x1036d4;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      puVar16[-0x33] = 0x103705;
      fprintf(_stderr,pcVar18,"kv_get_var_nentry_test");
      return;
    }
  }
  puVar16[-0x33] = kv_ins_var;
  kv_get_var_nentry_test();
  puVar16[-0x33] = puVar16 + -0x10;
  puVar16[-0x34] = lVar17;
  puVar16[-0x35] = pbVar14;
  puVar16[-0x36] = puVar21;
  puVar16[-0x37] = lVar22;
  puVar16[-0x38] = pbVar10;
  puVar16[-0x40] = 0x103738;
  gettimeofday((timeval *)(puVar16 + -0x3a),(__timezone_ptr_t)0x0);
  puVar16[-0x40] = 0x10373d;
  memleak_start();
  puVar16[-0x40] = 0x103747;
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  puVar21 = puVar16 + -0x3b;
  *puVar21 = puVar13;
  puVar16[-0x40] = 0x10377b;
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0xd08;
  pbVar10->flag = 0;
  pbVar10->level = 1;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = pbVar10 + 1;
  puVar19 = puVar16 + -0x3d;
  *puVar19 = 0x14;
  plVar1 = puVar16 + -0x3c;
  *plVar1 = 0;
  puVar16[-0x40] = 0x1037b4;
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var3 = pbVar14->ins_kv;
  puVar16[-0x40] = 0x1037c5;
  (*p_Var3)(pbVar10,0,puVar21,puVar19);
  p_Var3 = pbVar14->get_kv;
  puVar16[-0x40] = 0x1037d5;
  (*p_Var3)(pbVar10,0,plVar1,puVar16 + -0x3e);
  puVar16[-0x40] = 0x1037e5;
  iVar7 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar7 == 0) {
    if (puVar16[-0x3e] == puVar16[-0x3d]) {
      puVar16[-0x40] = 0x1037fd;
      free(pbVar10);
      puVar16[-0x40] = 0x103805;
      free(pbVar14);
      puVar16[-0x40] = 0x10380f;
      free((void *)puVar16[-0x3b]);
      puVar16[-0x40] = 0x103819;
      free((void *)puVar16[-0x3c]);
      puVar16[-0x40] = 0x10381e;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      puVar16[-0x40] = 0x10384f;
      fprintf(_stderr,pcVar18,"kv_ins_var");
      return;
    }
  }
  else {
    puVar16[-0x40] = 0x103863;
    kv_ins_var();
  }
  puVar16[-0x40] = kv_ins_var_nentry_test;
  kv_ins_var();
  puVar16[-0x40] = plVar1;
  puVar16[-0x41] = pbVar14;
  puVar16[-0x42] = "teststring";
  puVar16[-0x43] = puVar19;
  puVar16[-0x44] = puVar21;
  puVar16[-0x45] = pbVar10;
  puVar19 = puVar16 + -0x4a;
  lVar17 = 0;
  puVar16[-0x4b] = 0x103886;
  gettimeofday((timeval *)(puVar16 + -0x4a),(__timezone_ptr_t)0x0);
  puVar16[-0x4b] = 0x10388b;
  memleak_start();
  puVar21 = puVar16 + -0x48;
  bVar5 = true;
  do {
    bVar20 = bVar5;
    pcVar18 = (char *)(&DAT_00109d60)[lVar17];
    puVar16[-0x4b] = 0x1038a5;
    sVar11 = strlen(pcVar18);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    puVar16[-0x4b] = 0x1038b4;
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    puVar16[-0x4b] = 0x1038d1;
    memcpy(puVar12 + 1,pcVar18,uVar23);
    *puVar21 = puVar12;
    lVar17 = 1;
    puVar21 = puVar16 + -0x47;
    bVar5 = false;
  } while (bVar20);
  puVar16[-0x4b] = 0x1038f4;
  puVar15 = (undefined8 *)malloc(0x1010);
  *puVar15 = 0x2000100000901;
  puVar15[1] = puVar15 + 2;
  pcVar18 = (char *)((long)puVar16 + -0x229);
  *pcVar18 = 'd';
  puVar16[-0x5b] = 0x103923;
  btree_str_kv_get_kb64_vb64((btree_kv_ops *)(puVar16 + -0x5a));
  puVar16[-0x5b] = 0x103933;
  (*(code *)puVar16[-0x58])(puVar15,0,puVar16 + -0x48,pcVar18);
  *pcVar18 = *pcVar18 + '\x01';
  puVar16[-0x5b] = 0x103946;
  (*(code *)puVar16[-0x58])(puVar15,0,puVar16 + -0x47,pcVar18);
  lVar17 = puVar15[1];
  puVar16[-0x5b] = 0x10395a;
  iVar7 = strcmp((char *)(lVar17 + 2),"longstring");
  if (iVar7 == 0) {
    cVar26 = *(char *)(lVar17 + 0xd);
    puVar19 = (undefined8 *)CONCAT71((int7)((ulong)(puVar16 + -0x4a) >> 8),cVar26);
    if (cVar26 != *(char *)((long)puVar16 + -0x229)) goto LAB_001039b1;
    cVar26 = cVar26 + -1;
    puVar19 = (undefined8 *)CONCAT71((int7)((ulong)(puVar16 + -0x4a) >> 8),cVar26);
    *(char *)((long)puVar16 + -0x229) = cVar26;
    puVar16[-0x5b] = 0x10397f;
    iVar7 = strcmp((char *)(lVar17 + 0x10),"string");
    if (iVar7 == 0) {
      if (*(char *)(lVar17 + 0x17) == cVar26) {
        puVar16[-0x5b] = 0x10399d;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_001039bb;
    }
  }
  else {
    puVar16[-0x5b] = 0x1039b1;
    kv_ins_var_nentry_test();
LAB_001039b1:
    puVar16[-0x5b] = 0x1039b6;
    kv_ins_var_nentry_test();
  }
  puVar16[-0x5b] = 0x1039bb;
  kv_ins_var_nentry_test();
LAB_001039bb:
  puVar16[-0x5b] = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  puVar16[-0x5b] = puVar19;
  puVar16[-0x5c] = lVar17;
  puVar16[-0x5d] = puVar15;
  puVar16[-0x62] = 0x1039d5;
  gettimeofday((timeval *)(puVar16 + -0x5f),(__timezone_ptr_t)0x0);
  puVar16[-0x62] = 0x1039da;
  memleak_start();
  puVar16[-0x61] = 0;
  puVar16[-0x62] = 0x1039eb;
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  puVar16[-0x62] = 0x1039f8;
  puVar13 = (undefined2 *)malloc(0xd);
  *puVar13 = 0xb00;
  *(undefined8 *)(puVar13 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar13 + 9) = 0x676e69;
  pcVar18 = "teststring";
  puVar16[-0x60] = puVar13;
  p_Var4 = pbVar14->set_key;
  puVar16[-0x62] = 0x103a29;
  (*p_Var4)((btree *)0x0,puVar16 + -0x61,puVar16 + -0x60);
  pvVar25 = (void *)puVar16[-0x61];
  puVar16[-0x62] = 0x103a38;
  iVar7 = strcmp((char *)((long)pvVar25 + 2),"teststring");
  if (iVar7 == 0) {
    puVar16[-0x62] = 0x103a48;
    free(pvVar25);
    puVar16[-0x62] = 0x103a52;
    puVar13 = (undefined2 *)malloc(0x15);
    *puVar13 = 0x1300;
    pcVar18 = (char *)(puVar13 + 1);
    pcVar18[0] = 'u';
    pcVar18[1] = 'p';
    pcVar18[2] = 'd';
    pcVar18[3] = 'a';
    pcVar18[4] = 't';
    pcVar18[5] = 'e';
    pcVar18[6] = 'd';
    pcVar18[7] = ' ';
    pcVar18 = (char *)(puVar13 + 5);
    pcVar18[0] = 't';
    pcVar18[1] = 'e';
    pcVar18[2] = 's';
    pcVar18[3] = 't';
    pcVar18[4] = 's';
    pcVar18[5] = 't';
    pcVar18[6] = 'r';
    pcVar18[7] = 'i';
    *(undefined4 *)((long)puVar13 + 0x11) = 0x676e69;
    pcVar18 = "updated teststring";
    puVar16[-0x61] = puVar13;
    p_Var4 = pbVar14->set_key;
    puVar16[-0x62] = 0x103a83;
    (*p_Var4)((btree *)0x0,puVar16 + -0x60,puVar16 + -0x61);
    pvVar25 = (void *)puVar16[-0x60];
    puVar16[-0x62] = 0x103a92;
    iVar7 = strcmp((char *)((long)pvVar25 + 2),"updated teststring");
    if (iVar7 == 0) {
      puVar16[-0x62] = 0x103a9e;
      free(pbVar14);
      puVar16[-0x62] = 0x103aa6;
      free(pvVar25);
      puVar16[-0x62] = 0x103aaf;
      free((void *)puVar16[-0x61]);
      puVar16[-0x62] = 0x103ab4;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (kv_set_str_key_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      puVar16[-0x62] = 0x103ae5;
      fprintf(_stderr,pcVar18,"kv_set_str_key_test");
      return;
    }
  }
  else {
    puVar16[-0x62] = 0x103af4;
    kv_set_str_key_test();
  }
  puVar16[-0x62] = kv_set_str_value_test;
  kv_set_str_key_test();
  puVar16[-0x62] = pcVar18;
  puVar16[-99] = pvVar25;
  puVar16[-100] = puVar21;
  puVar16[-0x65] = pbVar14;
  puVar16[-0x71] = 0x103b10;
  gettimeofday((timeval *)(puVar16 + -0x6e),(__timezone_ptr_t)0x0);
  puVar16[-0x71] = 0x103b15;
  memleak_start();
  puVar16[-0x70] = 100;
  *(undefined1 *)((long)puVar16 + -0x35f) = 8;
  puVar16[-0x71] = 0x103b30;
  pbVar14 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var4 = pbVar14->set_value;
  puVar16[-0x71] = 0x103b44;
  (*p_Var4)((btree *)(puVar16 + -0x6c),puVar16 + -0x70,puVar16 + -0x6f);
  if (puVar16[-0x70] != puVar16[-0x6f]) {
    puVar16[-0x71] = 0x103b5a;
    kv_set_str_value_test();
  }
  plVar1 = puVar16 + -0x6f;
  *plVar1 = 200;
  p_Var4 = pbVar14->set_value;
  puVar16[-0x71] = 0x103b77;
  (*p_Var4)((btree *)(puVar16 + -0x6c),plVar1,puVar16 + -0x70);
  if (puVar16[-0x70] != *plVar1) {
    puVar16[-0x71] = 0x103b8c;
    kv_set_str_value_test();
  }
  puVar16[-0x71] = 0x103b94;
  free(pbVar14);
  puVar16[-0x71] = 0x103b99;
  memleak_end();
  pcVar18 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar18 = "%s FAILED\n";
  }
  puVar16[-0x71] = 0x103bca;
  fprintf(_stderr,pcVar18,"kv_set_str_value_test");
  return;
LAB_00103378:
  puVar16[-1] = 0x10337d;
  kv_set_var_nentry_update_test();
  goto LAB_0010337d;
}

Assistant:

void kv_set_var_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    void *key, *value;
    uint8_t ksize, vsize;
    int level;
    uint64_t v;
    int cmp;
    idx_t idx;
    char str[] = "teststring";
    key_len_t str_len = sizeof(str);

    vsize = sizeof(v);
    v = 10;

    construct_key_ptr(str, str_len, &key);
    value = alca(uint8_t, vsize);
    memset(value, 0, vsize);
    memcpy(value, &v, vsize);

    // init ops
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set key/value in node
    idx = 0;
    level = 1;
    ksize = str_len + sizeof(key_len_t);
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, &key, value);

    // verify node->data
    cmp = strcmp((char *)((uint8_t *)node->data + sizeof(key_len_t)), str);
    TEST_CHK(cmp == 0);
    cmp = memcmp((uint8_t *)node->data + ksize, value, vsize);
    TEST_CHK(cmp == 0);

    void *vars[] = {node, key};
    freevars(vars, sizeof(vars)/sizeof(void *));

    memleak_end();
    TEST_RESULT("kv set var test");
}